

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.hpp
# Opt level: O2

void ellipses::display_ellipses<cv::RotatedRect*>
               (Mat *image_test,RotatedRect *ellipses_begin,RotatedRect *ellipses_end)

{
  allocator<char> local_e9;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  _InputArray local_c0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  Mat tmp;
  
  cv::Mat::clone();
  local_a8 = 0;
  uStack_a4 = 0;
  uStack_a0 = 0;
  uStack_9c = 0x406fe000;
  for (; ellipses_begin != ellipses_end; ellipses_begin = ellipses_begin + 1) {
    local_c0.sz.width = 0;
    local_c0.sz.height = 0;
    local_c0.flags = 0x3010000;
    local_c0.obj = &tmp;
    cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_e8);
    local_e8 = CONCAT44(uStack_a4,local_a8);
    uStack_e0 = CONCAT44(uStack_9c,uStack_a0);
    local_d8 = 0;
    uStack_d0 = 0;
    cv::ellipse((_InputOutputArray *)&local_c0,ellipses_begin,(Scalar_ *)&local_e8,3,8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"Output",(allocator<char> *)&local_c0);
  cv::namedWindow((string *)&local_e8,0);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Output",&local_e9);
  local_c0.sz.width = 0;
  local_c0.sz.height = 0;
  local_c0.flags = 0x1010000;
  local_c0.obj = &tmp;
  cv::imshow((string *)&local_e8,&local_c0);
  std::__cxx11::string::~string((string *)&local_e8);
  cv::waitKey(0);
  cv::destroyAllWindows();
  cv::Mat::~Mat(&tmp);
  return;
}

Assistant:

void display_ellipses(const cv::Mat& image_test, IT ellipses_begin, IT ellipses_end)
{
    cv::Mat tmp = image_test.clone();
    while(ellipses_begin != ellipses_end)
    {
        cv::ellipse(tmp, *ellipses_begin, cv::Scalar(0, 255, 0), 3);
        ++ellipses_begin;
    }

    cv::namedWindow("Output", cv::WINDOW_NORMAL);
    cv::imshow("Output", tmp);
    cv::waitKey(0);
    cv::destroyAllWindows();
}